

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_float_suite::test_same(void)

{
  undefined4 local_38;
  undefined4 local_34;
  
  local_38 = 0x3f800000;
  local_34 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xed,"void mean_float_suite::test_same()",&local_38,&local_34);
  local_38 = 0x3f800000;
  local_34 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xef,"void mean_float_suite::test_same()",&local_38,&local_34);
  local_38 = 0x3f800000;
  local_34 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xf1,"void mean_float_suite::test_same()",&local_38,&local_34);
  return;
}

Assistant:

void test_same()
{
    decay::moment<float> filter(one_over_eight);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
}